

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

int rs_read_coord(FILE *inf,coord *c)

{
  coord in_RAX;
  coord in;
  coord local_18;
  
  if ((read_error == 0) && ((format_error & 1) == 0)) {
    local_18 = in_RAX;
    rs_read_int(inf,&local_18.x);
    in_RAX.x = rs_read_int(inf,&local_18.y);
    in_RAX.y = 0;
    if ((format_error == 0) && ((read_error & 1) == 0)) {
      *c = local_18;
      in_RAX = local_18;
    }
  }
  return in_RAX.x;
}

Assistant:

static int rs_read_coord(FILE *inf, coord *c)
{
    coord in;

    if (read_error || format_error)
        return(READSTAT);

    rs_read_int(inf,&in.x);
    rs_read_int(inf,&in.y);

    if (READSTAT == 0) 
    {
        c->x = in.x;
        c->y = in.y;
    }

    return(READSTAT);
}